

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p,
          set_block_pixels_context *context)

{
  char cVar1;
  dxt_format dVar2;
  element_type eVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  color_quad_u8 cVar8;
  bool bVar9;
  byte bVar10;
  uint i;
  uint uVar11;
  long lVar12;
  uchar uVar13;
  ulong uVar14;
  etc1_block *dst_block;
  etc1_block *dst_block_00;
  uint element_index;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar15;
  ulong uVar16;
  ulong uVar17;
  uint i_2;
  uint element_index_1;
  color_quad_u8 pixels [16];
  uint8 selectors [16];
  results results;
  
  cVar8.field_0 = pixels[1].field_0;
  uVar11 = this->m_num_elements_per_block;
  dVar2 = this->m_format;
  dst_block_00 = (etc1_block *)(this->m_pElements + (this->m_blocks_x * block_y + block_x) * uVar11)
  ;
  switch(dVar2) {
  case cETC1:
    pixels[0].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0;
    if (cCRNDXTQualityFast < p->m_quality) {
      pixels[0].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           ((p->m_quality != cCRNDXTQualityNormal) + 1);
    }
    pixels[1].field_0.field_0.r = p->m_dithering;
    goto LAB_0016db60;
  case cETC2:
    pixels[1].field_0.field_0.r = p->m_dithering;
    pixels[0].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0;
    if (cCRNDXTQualityFast < p->m_quality) {
      pixels[0].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           ((p->m_quality != cCRNDXTQualityNormal) + 1);
    }
LAB_0016db60:
    rg_etc1::pack_etc1_block(dst_block_00,(uint *)pPixels,(etc1_pack_params *)pixels);
    break;
  case cETC2A:
    uVar17 = 0;
    aVar15.m_u32 = (p->m_quality != cCRNDXTQualityNormal) + 1;
    if (p->m_quality < cCRNDXTQualityNormal) {
      aVar15.m_u32 = 0;
    }
    for (; uVar17 < uVar11; uVar17 = uVar17 + 1) {
      pixels[0].field_0 = aVar15;
      if (this->m_element_type[uVar17] == cAlphaETC2) {
        pixels[1].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (int)this->m_element_component_index[uVar17];
        rg_etc1::pack_etc2_alpha(dst_block_00,(uint *)pPixels,(etc2a_pack_params *)pixels);
      }
      else {
        pixels[1].field_0.field_0.r = p->m_dithering;
        rg_etc1::pack_etc1_block(dst_block_00,(uint *)pPixels,(etc1_pack_params *)pixels);
      }
      dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
      uVar11 = this->m_num_elements_per_block;
    }
    break;
  case cETC1S:
    uVar6 = p->m_perceptual;
    uVar7 = p->m_dithering;
    pixels[1].field_0.field_0.g = uVar7;
    pixels[1].field_0.field_0.r = uVar6;
    pixels[1].field_0.m_u32._2_2_ = cVar8.field_0._2_2_;
    pixels[0].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0;
    if (cCRNDXTQualityFast < p->m_quality) {
      pixels[0].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           ((p->m_quality != cCRNDXTQualityNormal) + 1);
    }
    pack_etc1s_block(dst_block_00,pPixels,(crn_etc1_pack_params *)pixels);
    break;
  case cETC2AS:
    for (uVar17 = 0; cVar8.field_0 = pixels[1].field_0, uVar17 < uVar11; uVar17 = uVar17 + 1) {
      if (this->m_element_type[uVar17] == cAlphaETC2) {
        pixels[0].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             ((p->m_quality != cCRNDXTQualityNormal) + 1);
        if (p->m_quality < cCRNDXTQualityNormal) {
          pixels[0].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0;
        }
        pixels[1].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (int)this->m_element_component_index[uVar17];
        rg_etc1::pack_etc2_alpha(dst_block_00,(uint *)pPixels,(etc2a_pack_params *)pixels);
      }
      else {
        uVar4 = p->m_perceptual;
        uVar5 = p->m_dithering;
        pixels[1].field_0.field_0.g = uVar5;
        pixels[1].field_0.field_0.r = uVar4;
        pixels[1].field_0.m_u32._2_2_ = cVar8.field_0._2_2_;
        pixels[0].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             ((p->m_quality != cCRNDXTQualityNormal) + 1);
        if (p->m_quality < cCRNDXTQualityNormal) {
          pixels[0].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0;
        }
        pack_etc1s_block(dst_block_00,pPixels,(crn_etc1_pack_params *)pixels);
      }
      dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
      uVar11 = this->m_num_elements_per_block;
    }
    break;
  default:
    if (p->m_compressor == cCRNDXTCompressorRYG) {
      if (((uint)dVar2 < 5) && ((0x19U >> (dVar2 & 0x1f) & 1) != 0)) {
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          pixels[lVar12].field_0.field_0.r = pPixels[lVar12].field_0.field_0.b;
          pixels[lVar12].field_0.field_0.g = pPixels[lVar12].field_0.field_0.g;
          pixels[lVar12].field_0.field_0.b = pPixels[lVar12].field_0.field_0.r;
          if (dVar2 == cDXT1) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = pPixels[lVar12].field_0.field_0.a;
          }
          pixels[lVar12].field_0.field_0.a = uVar13;
        }
        if (dVar2 == cDXT5A) {
          ryg_dxt::sCompressDXT5ABlock((sU8 *)dst_block_00,(sU32 *)pixels);
          return;
        }
        ryg_dxt::sCompressDXTBlock
                  ((ryg_dxt *)dst_block_00,(sU8 *)pixels,(sU32 *)(ulong)(dVar2 == cDXT5),false,
                   block_y);
        return;
      }
    }
    else if (dVar2 != cDXT1A && p->m_compressor == cCRNDXTCompressorCRNF) {
      for (uVar17 = 0; uVar17 < uVar11; uVar17 = uVar17 + 1) {
        eVar3 = this->m_element_type[uVar17];
        if (eVar3 == cAlphaDXT5) {
          dxt_fast::compress_alpha_block
                    ((dxt5_block *)dst_block_00,pPixels,(int)this->m_element_component_index[uVar17]
                    );
        }
        else if (eVar3 == cAlphaDXT3) {
          cVar1 = this->m_element_component_index[uVar17];
          for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
            dxt3_block::set_alpha
                      ((dxt3_block *)dst_block_00,(uint)uVar14 & 3,(uint)(uVar14 >> 2) & 0x3fffffff,
                       (uint)pPixels[uVar14].field_0.c[(uint)(int)cVar1],true);
          }
        }
        else if (eVar3 == cColorDXT1) {
          dxt_fast::compress_color_block
                    ((dxt1_block *)dst_block_00,pPixels,cCRNDXTQualityFast < p->m_quality);
        }
        dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
        uVar11 = this->m_num_elements_per_block;
      }
      return;
    }
    for (uVar17 = 0; uVar17 < uVar11; uVar17 = uVar17 + 1) {
      eVar3 = this->m_element_type[uVar17];
      if (eVar3 == cAlphaDXT5) {
        results.m_pSelectors = selectors;
        pixels[0].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (this->m_blocks_x * block_y + block_x);
        pixels[4].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
              )0x10;
        pixels[5].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (int)this->m_element_component_index[uVar17];
        pixels[6].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)p->m_quality;
        pixels[7].field_0._0_1_ = p->m_use_both_block_types;
        pixels._8_8_ = pPixels;
        bVar9 = dxt5_endpoint_optimizer::compute
                          (&context->m_dxt5_optimizer,(params *)pixels,&results);
        if (bVar9) {
          (dst_block_00->field_0).m_bytes[0] = results.m_first_endpoint;
          (dst_block_00->field_0).m_bytes[1] = results.m_second_endpoint;
          for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
            dxt5_block::set_selector
                      ((dxt5_block *)dst_block_00,(uint)uVar14 & 3,(uint)(uVar14 >> 2) & 0x3fffffff,
                       (uint)selectors[uVar14]);
          }
        }
      }
      else if (eVar3 == cAlphaDXT3) {
        cVar1 = this->m_element_component_index[uVar17];
        for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
          dxt3_block::set_alpha
                    ((dxt3_block *)dst_block_00,(uint)uVar14 & 3,(uint)(uVar14 >> 2) & 0x3fffffff,
                     (uint)pPixels[uVar14].field_0.c[(uint)(int)cVar1],true);
        }
      }
      else if (eVar3 == cColorDXT1) {
        pixels[5].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             p->m_dxt1a_alpha_threshold;
        if (this->m_format == cDXT1A) {
          uVar14 = 0;
          do {
            uVar16 = uVar14;
            if (uVar16 == 0x10) break;
            uVar14 = uVar16 + 1;
          } while ((uint)pixels[5].field_0 <= (uint)pPixels[uVar16].field_0.field_0.a);
          pixels[7].field_0._0_1_ = uVar16 < 0x10;
        }
        else {
          pixels[7].field_0._0_1_ = false;
        }
        results._16_8_ = selectors;
        pixels[8].field_0.field_0.b = '\0';
        pixels[0].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (this->m_blocks_x * block_y + block_x);
        pixels[6].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)p->m_quality;
        pixels[7].field_0._2_1_ = p->m_perceptual;
        pixels[7].field_0._3_1_ = p->m_grayscale_sampling;
        pixels[7].field_0._1_1_ = p->m_use_both_block_types;
        pixels[8].field_0._1_1_ = p->m_use_transparent_indices_for_black;
        pixels[4].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
              )0x10;
        pixels[8].field_0._0_1_ = p->m_endpoint_caching;
        if (1 < (uint)this->m_format) {
          pixels[7].field_0.field_0.g = '\0';
        }
        pixels._8_8_ = pPixels;
        bVar9 = dxt1_endpoint_optimizer::compute
                          (&context->m_dxt1_optimizer,(params *)pixels,(results *)&results);
        if (bVar9) {
          *(undefined2 *)&dst_block_00->field_0 = (undefined2)results.m_error;
          *(undefined2 *)((long)&dst_block_00->field_0 + 2) = results.m_error._2_2_;
          bVar10 = 0;
          for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
            uVar16 = uVar14 >> 2 & 0x3fffffff;
            dst_block_00->m_low_color[uVar16 - 4] =
                 selectors[uVar14] << (bVar10 & 6) |
                 ~(byte)(3 << (bVar10 & 6)) & dst_block_00->m_low_color[uVar16 - 4];
            bVar10 = bVar10 + 2;
          }
        }
      }
      dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
      uVar11 = this->m_num_elements_per_block;
    }
  }
  return;
}

Assistant:

void dxt_image::set_block_pixels(
        uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p,
        set_block_pixels_context& context)
    {
        element* pElement = &get_element(block_x, block_y, 0);

        if (m_format == cETC1)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);

#if CRNLIB_USE_RG_ETC1
            rg_etc1::etc1_quality etc_quality = rg_etc1::cHighQuality;
            if (p.m_quality <= cCRNDXTQualityFast)
            {
                etc_quality = rg_etc1::cLowQuality;
            }
            else if (p.m_quality <= cCRNDXTQualityNormal)
            {
                etc_quality = rg_etc1::cMediumQuality;
            }

            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            //pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
#else
            crn_etc_quality etc_quality = cCRNETCQualitySlow;
            if (p.m_quality <= cCRNDXTQualityFast)
                etc_quality = cCRNETCQualityFast;
            else if (p.m_quality <= cCRNDXTQualityNormal)
                etc_quality = cCRNETCQualityMedium;

            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            pack_params.m_dithering = p.m_dithering;

            pack_etc1_block(dst_block, pPixels, pack_params, context.m_etc1_optimizer);
#endif
        }
        else if (m_format == cETC2)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);
            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                   : rg_etc1::cHighQuality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
        }
        else if (m_format == cETC2A)
        {
            rg_etc1::etc1_quality etc_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                               : rg_etc1::cHighQuality;
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = etc_quality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    rg_etc1::etc1_pack_params pack_params;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = etc_quality;
                    rg_etc1::pack_etc1_block(pElement, (uint32*)pPixels, pack_params);
                }
            }
        }
        else if (m_format == cETC1S)
        {
            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                 : cCRNETCQualitySlow;
            pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
        }
        else if (m_format == cETC2AS)
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                           : rg_etc1::cHighQuality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    crn_etc1_pack_params pack_params;
                    pack_params.m_perceptual = p.m_perceptual;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                         : cCRNETCQualitySlow;
                    pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
                }
            }
        }
        else
#if CRNLIB_SUPPORT_SQUISH
            if ((p.m_compressor == cCRNDXTCompressorSquish) && ((m_format == cDXT1) || (m_format == cDXT1A) || (m_format == cDXT3) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            uint squish_flags = 0;
            if ((m_format == cDXT1) || (m_format == cDXT1A))
                squish_flags = squish::kDxt1;
            else if (m_format == cDXT3)
                squish_flags = squish::kDxt3;
            else if (m_format == cDXT5A)
                squish_flags = squish::kDxt5A;
            else
                squish_flags = squish::kDxt5;

            if (p.m_perceptual)
                squish_flags |= squish::kColourMetricPerceptual;
            else
                squish_flags |= squish::kColourMetricUniform;

            if (p.m_quality >= cCRNDXTQualityBetter)
                squish_flags |= squish::kColourIterativeClusterFit;
            else if (p.m_quality == cCRNDXTQualitySuperFast)
                squish_flags |= squish::kColourRangeFit;

            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            memcpy(pixels, pPixels, sizeof(color_quad_u8) * cDXTBlockSize * cDXTBlockSize);

            if (m_format == cDXT1)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    pixels[i].a = 255;
            }
            else if (m_format == cDXT1A)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    if (pixels[i].a < p.m_dxt1a_alpha_threshold)
                        pixels[i].a = 0;
                    else
                        pixels[i].a = 255;
            }

            squish::Compress(reinterpret_cast<const squish::u8*>(pixels), pElement, squish_flags);
        }

        else
#endif // CRNLIB_SUPPORT_SQUISH \
    // RYG doesn't support DXT1A
            if ((p.m_compressor == cCRNDXTCompressorRYG) && ((m_format == cDXT1) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
            {
                pixels[i].r = pPixels[i].b;
                pixels[i].g = pPixels[i].g;
                pixels[i].b = pPixels[i].r;

                if (m_format != cDXT1)
                {
                    pixels[i].a = pPixels[i].a;
                }
                else
                {
                    pixels[i].a = 255;
                }
            }

            if (m_format == cDXT5A)
            {
                ryg_dxt::sCompressDXT5ABlock((sU8*)pElement, (const sU32*)pixels);
            }
            else
            {
                ryg_dxt::sCompressDXTBlock((sU8*)pElement, (const sU32*)pixels, m_format == cDXT5, 0);
            }
        }
        else if ((p.m_compressor == cCRNDXTCompressorCRNF) && (m_format != cDXT1A))
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);
                    dxt_fast::compress_color_block(pDXT1_block, pPixels, p.m_quality >= cCRNDXTQualityNormal);

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);
                    dxt_fast::compress_alpha_block(pDXT5_block, pPixels, m_element_component_index[element_index]);

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
        else
        {
            dxt1_endpoint_optimizer& dxt1_optimizer = context.m_dxt1_optimizer;
            dxt5_endpoint_optimizer& dxt5_optimizer = context.m_dxt5_optimizer;

            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                    bool pixels_have_alpha = false;
                    if (m_format == cDXT1A)
                    {
                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            if (pPixels[i].a < p.m_dxt1a_alpha_threshold)
                            {
                                pixels_have_alpha = true;
                                break;
                            }
                        }
                    }

                    dxt1_endpoint_optimizer::results results;
                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt1_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_quality = p.m_quality;
                    params.m_perceptual = p.m_perceptual;
                    params.m_grayscale_sampling = p.m_grayscale_sampling;
                    params.m_pixels_have_alpha = pixels_have_alpha;
                    params.m_use_alpha_blocks = p.m_use_both_block_types;
                    params.m_use_transparent_indices_for_black = p.m_use_transparent_indices_for_black;
                    params.m_dxt1a_alpha_threshold = p.m_dxt1a_alpha_threshold;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_endpoint_caching = p.m_endpoint_caching;

                    if ((m_format != cDXT1) && (m_format != cDXT1A))
                    {
                        params.m_use_alpha_blocks = false;
                    }

                    if (!dxt1_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT1_block->set_low_color(results.m_low_color);
                    pDXT1_block->set_high_color(results.m_high_color);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT1_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                    dxt5_endpoint_optimizer::results results;

                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt5_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_comp_index = m_element_component_index[element_index];
                    params.m_quality = p.m_quality;
                    params.m_use_both_block_types = p.m_use_both_block_types;

                    if (!dxt5_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT5_block->set_low_alpha(results.m_first_endpoint);
                    pDXT5_block->set_high_alpha(results.m_second_endpoint);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT5_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
    }